

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error FT_New_GlyphSlot(FT_Face face,FT_GlyphSlot *aslot)

{
  FT_Driver pFVar1;
  FT_Memory memory;
  FT_Memory memory_00;
  FT_Driver_Class pFVar2;
  FT_Slot_InitFunc p_Var3;
  FT_GlyphSlot slot;
  FT_Slot_Internal aloader;
  int local_38;
  FT_Error local_34;
  
  if (face == (FT_Face)0x0) {
    local_38 = 0x23;
  }
  else {
    pFVar1 = face->driver;
    if (pFVar1 == (FT_Driver)0x0) {
      local_38 = 6;
    }
    else {
      memory = (pFVar1->root).memory;
      slot = (FT_GlyphSlot)ft_mem_alloc(memory,pFVar1->clazz->slot_object_size,&local_38);
      if (local_38 == 0) {
        slot->face = face;
        pFVar1 = face->driver;
        memory_00 = (pFVar1->root).memory;
        pFVar2 = pFVar1->clazz;
        local_34 = 0;
        slot->library = (pFVar1->root).library;
        aloader = (FT_Slot_Internal)ft_mem_alloc(memory_00,0x48,&local_34);
        local_38 = local_34;
        if (((local_34 == 0) &&
            ((slot->internal = aloader, (((pFVar1->root).clazz)->module_flags & 0x200) != 0 ||
             (local_38 = FT_GlyphLoader_New(memory_00,(FT_GlyphLoader *)aloader), local_38 == 0))))
           && ((p_Var3 = pFVar2->init_slot, p_Var3 == (FT_Slot_InitFunc)0x0 ||
               (local_38 = (*p_Var3)(slot), local_38 == 0)))) {
          slot->next = face->glyph;
          face->glyph = slot;
          local_38 = 0;
          if (aslot != (FT_GlyphSlot *)0x0) {
            *aslot = slot;
          }
        }
        else {
          ft_glyphslot_done(slot);
          (*memory->free)(memory,slot);
        }
      }
      else if (aslot != (FT_GlyphSlot *)0x0) {
        *aslot = (FT_GlyphSlot)0x0;
      }
    }
  }
  return local_38;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_New_GlyphSlot( FT_Face        face,
                    FT_GlyphSlot  *aslot )
  {
    FT_Error         error;
    FT_Driver        driver;
    FT_Driver_Class  clazz;
    FT_Memory        memory;
    FT_GlyphSlot     slot = NULL;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !face->driver )
      return FT_THROW( Invalid_Argument );

    driver = face->driver;
    clazz  = driver->clazz;
    memory = driver->root.memory;

    FT_TRACE4(( "FT_New_GlyphSlot: Creating new slot object\n" ));
    if ( !FT_ALLOC( slot, clazz->slot_object_size ) )
    {
      slot->face = face;

      error = ft_glyphslot_init( slot );
      if ( error )
      {
        ft_glyphslot_done( slot );
        FT_FREE( slot );
        goto Exit;
      }

      slot->next  = face->glyph;
      face->glyph = slot;

      if ( aslot )
        *aslot = slot;
    }
    else if ( aslot )
      *aslot = NULL;


  Exit:
    FT_TRACE4(( "FT_New_GlyphSlot: Return 0x%x\n", error ));

    return error;
  }